

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [12];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  byte bVar37;
  char cVar38;
  byte bVar39;
  byte bVar40;
  size_t mask;
  ulong uVar41;
  byte bVar42;
  ushort uVar43;
  uint uVar44;
  NodeRef *pNVar45;
  NodeRef root;
  uint uVar46;
  undefined4 uVar47;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar48;
  bool bVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_13;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 ai_2;
  undefined1 auVar75 [16];
  vint4 ai;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 ai_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vint4 ai_3;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi_1;
  undefined1 auVar85 [16];
  float fVar86;
  float fVar88;
  float fVar89;
  vint4 bi_3;
  float fVar90;
  undefined1 auVar87 [16];
  vint4 bi_2;
  vfloat4 a0;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  int iVar52;
  int iVar70;
  int iVar71;
  int iVar72;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar60 = *(undefined1 (*) [16])(ray + 0x80);
    auVar55 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar33 = ZEXT812(0) << 0x20;
    auVar56 = ZEXT816(0) << 0x40;
    uVar13 = vcmpps_avx512vl(auVar60,auVar56,5);
    uVar50 = vpcmpeqd_avx512vl(auVar55,(undefined1  [16])valid_i->field_0);
    uVar50 = ((byte)uVar13 & 0xf) & uVar50;
    bVar40 = (byte)uVar50;
    if (bVar40 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar6 = tray.dir.field_0._32_4_;
      auVar53._0_4_ = fVar6 * fVar6;
      fVar7 = tray.dir.field_0._36_4_;
      auVar53._4_4_ = fVar7 * fVar7;
      fVar8 = tray.dir.field_0._40_4_;
      auVar53._8_4_ = fVar8 * fVar8;
      fVar9 = tray.dir.field_0._44_4_;
      auVar53._12_4_ = fVar9 * fVar9;
      auVar54 = vfmadd231ps_fma(auVar53,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54 = vfmadd231ps_fma(auVar54,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar53 = vrsqrt14ps_avx512vl(auVar54);
      auVar59._8_4_ = 0xbf000000;
      auVar59._0_8_ = 0xbf000000bf000000;
      auVar59._12_4_ = 0xbf000000;
      auVar54 = vmulps_avx512vl(auVar54,auVar59);
      fVar86 = auVar53._0_4_;
      fVar88 = auVar53._4_4_;
      fVar89 = auVar53._8_4_;
      fVar90 = auVar53._12_4_;
      auVar61._0_4_ = fVar86 * fVar86 * fVar86 * auVar54._0_4_;
      auVar61._4_4_ = fVar88 * fVar88 * fVar88 * auVar54._4_4_;
      auVar61._8_4_ = fVar89 * fVar89 * fVar89 * auVar54._8_4_;
      auVar61._12_4_ = fVar90 * fVar90 * fVar90 * auVar54._12_4_;
      auVar54._8_4_ = 0x3fc00000;
      auVar54._0_8_ = 0x3fc000003fc00000;
      auVar54._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar61,auVar53,auVar54);
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      uVar41 = uVar50;
      do {
        lVar16 = 0;
        for (uVar51 = uVar41; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar51 = (ulong)(uint)((int)lVar16 * 4);
        auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar51 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar51 + 0x50)),0x1c);
        fVar86 = *(float *)((long)pre.ray_space + (uVar51 - 0x10));
        auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + uVar51 + 0x60)),0x28);
        auVar64._0_4_ = auVar54._0_4_ * fVar86;
        auVar64._4_4_ = auVar54._4_4_ * fVar86;
        auVar64._8_4_ = auVar54._8_4_ * fVar86;
        auVar64._12_4_ = auVar54._12_4_ * fVar86;
        auVar59 = vshufpd_avx(auVar64,auVar64,1);
        auVar54 = vmovshdup_avx(auVar64);
        auVar95._0_4_ = auVar54._0_4_ ^ 0x80000000;
        auVar61 = vunpckhps_avx(auVar64,auVar56);
        auVar69._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
        auVar69._8_8_ = auVar59._8_8_ ^ auVar62._8_8_;
        auVar53 = vinsertps_avx(auVar69,auVar64,0x2a);
        auVar54 = vdpps_avx(auVar53,auVar53,0x7f);
        auVar95._4_12_ = auVar33;
        auVar61 = vshufps_avx(auVar61,auVar95,0x41);
        auVar59 = vdpps_avx(auVar61,auVar61,0x7f);
        uVar13 = vcmpps_avx512vl(auVar54,auVar59,1);
        auVar54 = vpmovm2d_avx512vl(uVar13);
        auVar98._0_4_ = auVar54._0_4_;
        auVar98._4_4_ = auVar98._0_4_;
        auVar98._8_4_ = auVar98._0_4_;
        auVar98._12_4_ = auVar98._0_4_;
        uVar51 = vpmovd2m_avx512vl(auVar98);
        auVar63._4_4_ = (uint)((byte)(uVar51 >> 1) & 1) * auVar55._4_4_;
        auVar63._0_4_ = (uint)((byte)uVar51 & 1) * auVar55._0_4_;
        auVar63._8_4_ = (uint)((byte)(uVar51 >> 2) & 1) * auVar55._8_4_;
        auVar63._12_4_ = (uint)((byte)(uVar51 >> 3) & 1) * auVar55._12_4_;
        auVar54 = vblendvps_avx(auVar53,auVar61,auVar63);
        auVar59 = vdpps_avx(auVar54,auVar54,0x7f);
        auVar99._4_12_ = auVar33;
        auVar99._0_4_ = auVar59._0_4_;
        auVar53 = vrsqrt14ss_avx512f(auVar56,auVar99);
        fVar88 = auVar53._0_4_;
        fVar88 = fVar88 * 1.5 - auVar59._0_4_ * 0.5 * fVar88 * fVar88 * fVar88;
        auVar93._0_4_ = auVar54._0_4_ * fVar88;
        auVar93._4_4_ = auVar54._4_4_ * fVar88;
        auVar93._8_4_ = auVar54._8_4_ * fVar88;
        auVar93._12_4_ = auVar54._12_4_ * fVar88;
        auVar54 = vshufps_avx(auVar93,auVar93,0xc9);
        auVar59 = vshufps_avx(auVar64,auVar64,0xc9);
        auVar100._0_4_ = auVar93._0_4_ * auVar59._0_4_;
        auVar100._4_4_ = auVar93._4_4_ * auVar59._4_4_;
        auVar100._8_4_ = auVar93._8_4_ * auVar59._8_4_;
        auVar100._12_4_ = auVar93._12_4_ * auVar59._12_4_;
        auVar54 = vfmsub231ps_fma(auVar100,auVar64,auVar54);
        auVar59 = vshufps_avx(auVar54,auVar54,0xc9);
        auVar54 = vdpps_avx(auVar59,auVar59,0x7f);
        uVar41 = uVar41 - 1 & uVar41;
        auVar101._4_12_ = auVar33;
        auVar101._0_4_ = auVar54._0_4_;
        auVar53 = vrsqrt14ss_avx512f(auVar56,auVar101);
        fVar88 = auVar53._0_4_;
        fVar88 = fVar88 * 1.5 - auVar54._0_4_ * 0.5 * fVar88 * fVar88 * fVar88;
        auVar96._0_4_ = fVar88 * auVar59._0_4_;
        auVar96._4_4_ = fVar88 * auVar59._4_4_;
        auVar96._8_4_ = fVar88 * auVar59._8_4_;
        auVar96._12_4_ = fVar88 * auVar59._12_4_;
        auVar68._0_4_ = fVar86 * auVar64._0_4_;
        auVar68._4_4_ = fVar86 * auVar64._4_4_;
        auVar68._8_4_ = fVar86 * auVar64._8_4_;
        auVar68._12_4_ = fVar86 * auVar64._12_4_;
        auVar53 = vunpcklps_avx(auVar93,auVar68);
        auVar54 = vunpckhps_avx(auVar93,auVar68);
        auVar61 = vunpcklps_avx(auVar96,auVar56);
        auVar59 = vunpckhps_avx(auVar96,auVar56);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar54,auVar59);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar53,auVar61);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar53,auVar61);
        pre.ray_space[lVar16].vx.field_0 = aVar12;
        pre.ray_space[lVar16].vy.field_0 = aVar10;
        pre.ray_space[lVar16].vz.field_0 = aVar11;
      } while (uVar41 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar104 = ZEXT1664(auVar55);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar105 = ZEXT1664(auVar56);
      auVar54 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar55);
      uVar41 = vcmpps_avx512vl(auVar54,auVar56,1);
      bVar49 = (bool)((byte)uVar41 & 1);
      iVar52 = auVar56._0_4_;
      auVar57._0_4_ = (uint)bVar49 * iVar52 | (uint)!bVar49 * tray.dir.field_0._0_4_;
      bVar49 = (bool)((byte)(uVar41 >> 1) & 1);
      iVar70 = auVar56._4_4_;
      auVar57._4_4_ = (uint)bVar49 * iVar70 | (uint)!bVar49 * tray.dir.field_0._4_4_;
      bVar49 = (bool)((byte)(uVar41 >> 2) & 1);
      iVar71 = auVar56._8_4_;
      iVar72 = auVar56._12_4_;
      auVar57._8_4_ = (uint)bVar49 * iVar71 | (uint)!bVar49 * tray.dir.field_0._8_4_;
      bVar49 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar49 * iVar72 | (uint)!bVar49 * tray.dir.field_0._12_4_;
      auVar54 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar55);
      uVar41 = vcmpps_avx512vl(auVar54,auVar56,1);
      bVar49 = (bool)((byte)uVar41 & 1);
      auVar58._0_4_ = (uint)bVar49 * iVar52 | (uint)!bVar49 * tray.dir.field_0._16_4_;
      bVar49 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar49 * iVar70 | (uint)!bVar49 * tray.dir.field_0._20_4_;
      bVar49 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar49 * iVar71 | (uint)!bVar49 * tray.dir.field_0._24_4_;
      bVar49 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar49 * iVar72 | (uint)!bVar49 * tray.dir.field_0._28_4_;
      auVar55 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar55);
      uVar41 = vcmpps_avx512vl(auVar55,auVar56,1);
      bVar49 = (bool)((byte)uVar41 & 1);
      auVar55._0_4_ = (uint)bVar49 * iVar52 | (uint)!bVar49 * (int)fVar6;
      bVar49 = (bool)((byte)(uVar41 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar49 * iVar70 | (uint)!bVar49 * (int)fVar7;
      bVar49 = (bool)((byte)(uVar41 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar49 * iVar71 | (uint)!bVar49 * (int)fVar8;
      bVar49 = (bool)((byte)(uVar41 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar49 * iVar72 | (uint)!bVar49 * (int)fVar9;
      auVar56 = vrcp14ps_avx512vl(auVar57);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar106 = ZEXT1664(auVar54);
      auVar59 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      auVar107 = ZEXT1664(auVar59);
      auVar53 = vfnmadd213ps_avx512vl(auVar57,auVar56,auVar54);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar56,auVar56)
      ;
      auVar56 = vrcp14ps_avx512vl(auVar58);
      auVar53 = vfnmadd213ps_avx512vl(auVar58,auVar56,auVar54);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar56,auVar56)
      ;
      auVar56 = vrcp14ps_avx512vl(auVar55);
      auVar55 = vfnmadd213ps_avx512vl(auVar55,auVar56,auVar54);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar55,auVar56,auVar56)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar41 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar59,1);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar55._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar41 & 1) * auVar55._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar55._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar55._12_4_;
      uVar41 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar59,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar49 = (bool)((byte)uVar41 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar49 * auVar55._0_4_ | (uint)!bVar49 * 0x30;
      bVar49 = (bool)((byte)(uVar41 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar49 * auVar55._4_4_ | (uint)!bVar49 * 0x30;
      bVar49 = (bool)((byte)(uVar41 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar49 * auVar55._8_4_ | (uint)!bVar49 * 0x30;
      bVar49 = (bool)((byte)(uVar41 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar49 * auVar55._12_4_ | (uint)!bVar49 * 0x30;
      uVar41 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar59,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar49 = (bool)((byte)uVar41 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar49 * auVar55._0_4_ | (uint)!bVar49 * 0x50;
      bVar49 = (bool)((byte)(uVar41 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar49 * auVar55._4_4_ | (uint)!bVar49 * 0x50;
      bVar49 = (bool)((byte)(uVar41 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar49 * auVar55._8_4_ | (uint)!bVar49 * 0x50;
      bVar49 = (bool)((byte)(uVar41 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar49 * auVar55._12_4_ | (uint)!bVar49 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar109 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar55 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar59);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar40 & 1) * auVar55._0_4_ |
           (uint)!(bool)(bVar40 & 1) * stack_near[0].field_0._0_4_;
      bVar49 = (bool)((byte)(uVar50 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar49 * auVar55._4_4_ | (uint)!bVar49 * stack_near[0].field_0._4_4_;
      bVar49 = (bool)((byte)(uVar50 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar49 * auVar55._8_4_ | (uint)!bVar49 * stack_near[0].field_0._8_4_;
      bVar49 = SUB81(uVar50 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar49 * auVar55._12_4_ | (uint)!bVar49 * stack_near[0].field_0._12_4_;
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = ZEXT1664(auVar55);
      auVar60 = vmaxps_avx512vl(auVar60,auVar59);
      tray.tfar.field_0.i[0] =
           (uint)(bVar40 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar40 & 1) * auVar55._0_4_;
      bVar49 = (bool)((byte)(uVar50 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar49 * auVar60._4_4_ | (uint)!bVar49 * auVar55._4_4_;
      bVar49 = (bool)((byte)(uVar50 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar49 * auVar60._8_4_ | (uint)!bVar49 * auVar55._8_4_;
      bVar49 = SUB81(uVar50 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar49 * auVar60._12_4_ | (uint)!bVar49 * auVar55._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar46 = 3;
      }
      else {
        uVar46 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      uVar43 = (ushort)uVar50 ^ 0xf;
      pNVar45 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar48 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar48 = paVar48 + -1;
        root.ptr = pNVar45[-1].ptr;
        pNVar45 = pNVar45 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00744fb5:
          iVar52 = 3;
        }
        else {
          aVar1 = *paVar48;
          uVar50 = vcmpps_avx512vl((undefined1  [16])aVar1,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar50 == '\0') {
LAB_00744fb9:
            iVar52 = 2;
          }
          else {
            uVar47 = (undefined4)uVar50;
            iVar52 = 0;
            if ((uint)POPCOUNT(uVar47) <= uVar46) {
              do {
                sVar2 = 0;
                for (uVar41 = uVar50; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000)
                {
                  sVar2 = sVar2 + 1;
                }
                bVar49 = occluded1(This,bvh,root,sVar2,&pre,ray,&tray,context);
                bVar37 = (byte)(1 << ((uint)sVar2 & 0x1f));
                if (!bVar49) {
                  bVar37 = 0;
                }
                bVar37 = (byte)uVar43 | bVar37;
                uVar43 = (ushort)bVar37;
                uVar50 = uVar50 - 1 & uVar50;
              } while (uVar50 != 0);
              if (bVar37 == 0xf) {
                iVar52 = 3;
              }
              else {
                auVar60 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar37 & 1) * auVar60._0_4_ |
                     (uint)!(bool)(bVar37 & 1) * tray.tfar.field_0.i[0];
                bVar49 = (bool)(bVar37 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar49 * auVar60._4_4_ | (uint)!bVar49 * tray.tfar.field_0.i[1];
                bVar49 = (bool)(bVar37 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar49 * auVar60._8_4_ | (uint)!bVar49 * tray.tfar.field_0.i[2];
                bVar49 = (bool)(bVar37 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar49 * auVar60._12_4_ | (uint)!bVar49 * tray.tfar.field_0.i[3];
                iVar52 = 2;
              }
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar104 = ZEXT1664(auVar60);
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar105 = ZEXT1664(auVar60);
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar106 = ZEXT1664(auVar60);
              auVar60 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
              auVar107 = ZEXT1664(auVar60);
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar108 = ZEXT1664(auVar60);
              auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar109 = ZEXT1664(auVar60);
            }
            auVar60 = auVar107._0_16_;
            auVar110 = ZEXT1664((undefined1  [16])aVar1);
            if (uVar46 < (uint)POPCOUNT(uVar47)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00744fb5;
                  uVar13 = vcmpps_avx512vl(auVar110._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar13 != '\0') {
                    bVar37 = (byte)uVar43 & 0xf;
                    if (bVar37 == 0xf) {
                      bVar39 = 0;
                    }
                    else {
                      uVar50 = (ulong)(bVar37 ^ 0xf);
                      bVar37 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      bVar39 = 0;
                      do {
                        lVar16 = 0;
                        for (uVar41 = uVar50; (uVar41 & 1) == 0;
                            uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                          lVar16 = lVar16 + 1;
                        }
                        cVar38 = (**(code **)((long)pvVar3 + (ulong)bVar37 * 0x40 + 0x18))
                                           (&pre,ray,lVar16,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        auVar60 = auVar107._0_16_;
                        bVar42 = (byte)(1 << ((uint)lVar16 & 0x1f));
                        if (cVar38 == '\0') {
                          bVar42 = 0;
                        }
                        bVar39 = bVar39 | bVar42;
                        uVar50 = uVar50 - 1 & uVar50;
                      } while (uVar50 != 0);
                    }
                    bVar39 = (byte)uVar43 | bVar39;
                    uVar43 = (ushort)bVar39;
                    if (bVar39 == 0xf) {
                      iVar52 = 3;
                    }
                    else {
                      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      tray.tfar.field_0.i[0] =
                           (uint)(bVar39 & 1) * auVar55._0_4_ |
                           (uint)!(bool)(bVar39 & 1) * tray.tfar.field_0.i[0];
                      bVar49 = (bool)(bVar39 >> 1 & 1);
                      tray.tfar.field_0.i[1] =
                           (uint)bVar49 * auVar55._4_4_ | (uint)!bVar49 * tray.tfar.field_0.i[1];
                      bVar49 = (bool)(bVar39 >> 2 & 1);
                      tray.tfar.field_0.i[2] =
                           (uint)bVar49 * auVar55._8_4_ | (uint)!bVar49 * tray.tfar.field_0.i[2];
                      bVar49 = (bool)(bVar39 >> 3 & 1);
                      tray.tfar.field_0.i[3] =
                           (uint)bVar49 * auVar55._12_4_ | (uint)!bVar49 * tray.tfar.field_0.i[3];
                      iVar52 = 0;
                    }
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar104 = ZEXT1664(auVar55);
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar105 = ZEXT1664(auVar55);
                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar106 = ZEXT1664(auVar55);
                    auVar60 = vxorps_avx512vl(auVar60,auVar60);
                    auVar107 = ZEXT1664(auVar60);
                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar108 = ZEXT1664(auVar60);
                    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar109 = ZEXT1664(auVar60);
                    break;
                  }
                  goto LAB_00744fb9;
                }
                uVar13 = vcmpps_avx512vl(auVar110._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                uVar41 = root.ptr & 0xfffffffffffffff0;
                uVar44 = (uint)root.ptr & 7;
                auVar110 = ZEXT1664(auVar109._0_16_);
                uVar50 = 0;
                root.ptr = 8;
                do {
                  sVar2 = *(size_t *)(uVar41 + uVar50 * 8);
                  if (sVar2 != 8) {
                    if ((uVar44 == 6) || (uVar44 == 1)) {
                      uVar47 = *(undefined4 *)(uVar41 + 0x80 + uVar50 * 4);
                      auVar76._4_4_ = uVar47;
                      auVar76._0_4_ = uVar47;
                      auVar76._8_4_ = uVar47;
                      auVar76._12_4_ = uVar47;
                      auVar55 = *(undefined1 (*) [16])(ray + 0x70);
                      uVar47 = *(undefined4 *)(uVar41 + 0x20 + uVar50 * 4);
                      auVar56._4_4_ = uVar47;
                      auVar56._0_4_ = uVar47;
                      auVar56._8_4_ = uVar47;
                      auVar56._12_4_ = uVar47;
                      auVar56 = vfmadd213ps_avx512vl(auVar76,auVar55,auVar56);
                      uVar47 = *(undefined4 *)(uVar41 + 0xa0 + uVar50 * 4);
                      auVar78._4_4_ = uVar47;
                      auVar78._0_4_ = uVar47;
                      auVar78._8_4_ = uVar47;
                      auVar78._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x40 + uVar50 * 4);
                      auVar17._4_4_ = uVar47;
                      auVar17._0_4_ = uVar47;
                      auVar17._8_4_ = uVar47;
                      auVar17._12_4_ = uVar47;
                      auVar54 = vfmadd213ps_avx512vl(auVar78,auVar55,auVar17);
                      uVar47 = *(undefined4 *)(uVar41 + 0xc0 + uVar50 * 4);
                      auVar80._4_4_ = uVar47;
                      auVar80._0_4_ = uVar47;
                      auVar80._8_4_ = uVar47;
                      auVar80._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x60 + uVar50 * 4);
                      auVar18._4_4_ = uVar47;
                      auVar18._0_4_ = uVar47;
                      auVar18._8_4_ = uVar47;
                      auVar18._12_4_ = uVar47;
                      auVar61 = vfmadd213ps_avx512vl(auVar80,auVar55,auVar18);
                      uVar47 = *(undefined4 *)(uVar41 + 0x90 + uVar50 * 4);
                      auVar82._4_4_ = uVar47;
                      auVar82._0_4_ = uVar47;
                      auVar82._8_4_ = uVar47;
                      auVar82._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x30 + uVar50 * 4);
                      auVar19._4_4_ = uVar47;
                      auVar19._0_4_ = uVar47;
                      auVar19._8_4_ = uVar47;
                      auVar19._12_4_ = uVar47;
                      auVar62 = vfmadd213ps_avx512vl(auVar82,auVar55,auVar19);
                      uVar47 = *(undefined4 *)(uVar41 + 0xb0 + uVar50 * 4);
                      auVar85._4_4_ = uVar47;
                      auVar85._0_4_ = uVar47;
                      auVar85._8_4_ = uVar47;
                      auVar85._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x50 + uVar50 * 4);
                      auVar20._4_4_ = uVar47;
                      auVar20._0_4_ = uVar47;
                      auVar20._8_4_ = uVar47;
                      auVar20._12_4_ = uVar47;
                      auVar63 = vfmadd213ps_avx512vl(auVar85,auVar55,auVar20);
                      uVar47 = *(undefined4 *)(uVar41 + 0xd0 + uVar50 * 4);
                      auVar87._4_4_ = uVar47;
                      auVar87._0_4_ = uVar47;
                      auVar87._8_4_ = uVar47;
                      auVar87._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x70 + uVar50 * 4);
                      auVar21._4_4_ = uVar47;
                      auVar21._0_4_ = uVar47;
                      auVar21._8_4_ = uVar47;
                      auVar21._12_4_ = uVar47;
                      auVar64 = vfmadd213ps_avx512vl(auVar87,auVar55,auVar21);
                      auVar59 = vfmsub213ps_fma(auVar56,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,
                                                (undefined1  [16])
                                                tray.org_rdir.field_0.field_0.x.field_0);
                      auVar53 = vfmsub213ps_fma(auVar54,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.y.field_0,
                                                (undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0);
                      auVar61 = vfmsub213ps_fma(auVar61,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.z.field_0,
                                                (undefined1  [16])
                                                tray.org_rdir.field_0.field_0.z.field_0);
                      auVar62 = vfmsub213ps_fma(auVar62,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,
                                                (undefined1  [16])
                                                tray.org_rdir.field_0.field_0.x.field_0);
                      auVar63 = vfmsub213ps_fma(auVar63,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.y.field_0,
                                                (undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0);
                      auVar64 = vfmsub213ps_fma(auVar64,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.z.field_0,
                                                (undefined1  [16])
                                                tray.org_rdir.field_0.field_0.z.field_0);
                      auVar56 = vpminsd_avx(auVar59,auVar62);
                      auVar54 = vpminsd_avx(auVar53,auVar63);
                      auVar56 = vpmaxsd_avx(auVar56,auVar54);
                      auVar54 = vpminsd_avx(auVar61,auVar64);
                      auVar56 = vpmaxsd_avx(auVar56,auVar54);
                      auVar54 = vpmaxsd_avx(auVar59,auVar62);
                      auVar59 = vpmaxsd_avx(auVar53,auVar63);
                      auVar59 = vpminsd_avx(auVar54,auVar59);
                      auVar54 = vpmaxsd_avx(auVar61,auVar64);
                      auVar59 = vpminsd_avx(auVar59,auVar54);
                      auVar54 = vpmaxsd_avx(auVar56,(undefined1  [16])tray.tnear.field_0);
                      auVar59 = vpminsd_avx(auVar59,(undefined1  [16])tray.tfar.field_0);
                      uVar14 = vcmpps_avx512vl(auVar54,auVar59,2);
                      bVar37 = (byte)uVar14;
                      if (uVar44 == 6) {
                        uVar47 = *(undefined4 *)(uVar41 + 0xf0 + uVar50 * 4);
                        auVar22._4_4_ = uVar47;
                        auVar22._0_4_ = uVar47;
                        auVar22._8_4_ = uVar47;
                        auVar22._12_4_ = uVar47;
                        uVar14 = vcmpps_avx512vl(auVar55,auVar22,1);
                        uVar47 = *(undefined4 *)(uVar41 + 0xe0 + uVar50 * 4);
                        auVar23._4_4_ = uVar47;
                        auVar23._0_4_ = uVar47;
                        auVar23._8_4_ = uVar47;
                        auVar23._12_4_ = uVar47;
                        uVar15 = vcmpps_avx512vl(auVar55,auVar23,0xd);
                        bVar37 = (byte)uVar14 & (byte)uVar15 & bVar37;
                      }
                    }
                    else {
                      uVar47 = *(undefined4 *)(uVar41 + 0x20 + uVar50 * 4);
                      auVar83._4_4_ = uVar47;
                      auVar83._0_4_ = uVar47;
                      auVar83._8_4_ = uVar47;
                      auVar83._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x30 + uVar50 * 4);
                      auVar81._4_4_ = uVar47;
                      auVar81._0_4_ = uVar47;
                      auVar81._8_4_ = uVar47;
                      auVar81._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x40 + uVar50 * 4);
                      auVar79._4_4_ = uVar47;
                      auVar79._0_4_ = uVar47;
                      auVar79._8_4_ = uVar47;
                      auVar79._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x50 + uVar50 * 4);
                      auVar94._4_4_ = uVar47;
                      auVar94._0_4_ = uVar47;
                      auVar94._8_4_ = uVar47;
                      auVar94._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x60 + uVar50 * 4);
                      auVar92._4_4_ = uVar47;
                      auVar92._0_4_ = uVar47;
                      auVar92._8_4_ = uVar47;
                      auVar92._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x70 + uVar50 * 4);
                      auVar91._4_4_ = uVar47;
                      auVar91._0_4_ = uVar47;
                      auVar91._8_4_ = uVar47;
                      auVar91._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x80 + uVar50 * 4);
                      auVar77._4_4_ = uVar47;
                      auVar77._0_4_ = uVar47;
                      auVar77._8_4_ = uVar47;
                      auVar77._12_4_ = uVar47;
                      uVar47 = *(undefined4 *)(uVar41 + 0x90 + uVar50 * 4);
                      auVar75._4_4_ = uVar47;
                      auVar75._0_4_ = uVar47;
                      auVar75._8_4_ = uVar47;
                      auVar75._12_4_ = uVar47;
                      fVar6 = *(float *)(uVar41 + 0xa0 + uVar50 * 4);
                      auVar73._4_4_ = fVar6;
                      auVar73._0_4_ = fVar6;
                      auVar73._8_4_ = fVar6;
                      auVar73._12_4_ = fVar6;
                      auVar55 = *(undefined1 (*) [16])(ray + 0x70);
                      auVar69 = auVar106._0_16_;
                      auVar56 = vsubps_avx512vl(auVar69,auVar55);
                      uVar47 = *(undefined4 *)(uVar41 + 0xe0 + uVar50 * 4);
                      auVar24._4_4_ = uVar47;
                      auVar24._0_4_ = uVar47;
                      auVar24._8_4_ = uVar47;
                      auVar24._12_4_ = uVar47;
                      auVar54 = vmulps_avx512vl(auVar55,auVar24);
                      uVar47 = *(undefined4 *)(uVar41 + 0xf0 + uVar50 * 4);
                      auVar25._4_4_ = uVar47;
                      auVar25._0_4_ = uVar47;
                      auVar25._8_4_ = uVar47;
                      auVar25._12_4_ = uVar47;
                      auVar59 = vmulps_avx512vl(auVar55,auVar25);
                      uVar47 = *(undefined4 *)(uVar41 + 0x100 + uVar50 * 4);
                      auVar26._4_4_ = uVar47;
                      auVar26._0_4_ = uVar47;
                      auVar26._8_4_ = uVar47;
                      auVar26._12_4_ = uVar47;
                      auVar53 = vmulps_avx512vl(auVar55,auVar26);
                      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar56,auVar60);
                      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar60);
                      uVar47 = *(undefined4 *)(uVar41 + 0x110 + uVar50 * 4);
                      auVar27._4_4_ = uVar47;
                      auVar27._0_4_ = uVar47;
                      auVar27._8_4_ = uVar47;
                      auVar27._12_4_ = uVar47;
                      auVar61 = vmulps_avx512vl(auVar55,auVar27);
                      uVar47 = *(undefined4 *)(uVar41 + 0x120 + uVar50 * 4);
                      auVar28._4_4_ = uVar47;
                      auVar28._0_4_ = uVar47;
                      auVar28._8_4_ = uVar47;
                      auVar28._12_4_ = uVar47;
                      auVar62 = vmulps_avx512vl(auVar55,auVar28);
                      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar60);
                      uVar47 = *(undefined4 *)(uVar41 + 0x130 + uVar50 * 4);
                      auVar29._4_4_ = uVar47;
                      auVar29._0_4_ = uVar47;
                      auVar29._8_4_ = uVar47;
                      auVar29._12_4_ = uVar47;
                      auVar55 = vmulps_avx512vl(auVar55,auVar29);
                      auVar102._0_4_ = auVar56._0_4_ + auVar61._0_4_;
                      auVar102._4_4_ = auVar56._4_4_ + auVar61._4_4_;
                      auVar102._8_4_ = auVar56._8_4_ + auVar61._8_4_;
                      auVar102._12_4_ = auVar56._12_4_ + auVar61._12_4_;
                      auVar61 = vaddps_avx512vl(auVar56,auVar62);
                      auVar97._0_4_ = auVar56._0_4_ + auVar55._0_4_;
                      auVar97._4_4_ = auVar56._4_4_ + auVar55._4_4_;
                      auVar97._8_4_ = auVar56._8_4_ + auVar55._8_4_;
                      auVar97._12_4_ = auVar56._12_4_ + auVar55._12_4_;
                      auVar34._4_4_ = tray.org.field_0._4_4_;
                      auVar34._0_4_ = tray.org.field_0._0_4_;
                      auVar34._8_4_ = tray.org.field_0._8_4_;
                      auVar34._12_4_ = tray.org.field_0._12_4_;
                      auVar35._4_4_ = tray.org.field_0._20_4_;
                      auVar35._0_4_ = tray.org.field_0._16_4_;
                      auVar35._8_4_ = tray.org.field_0._24_4_;
                      auVar35._12_4_ = tray.org.field_0._28_4_;
                      auVar36._4_4_ = tray.org.field_0._36_4_;
                      auVar36._0_4_ = tray.org.field_0._32_4_;
                      auVar36._8_4_ = tray.org.field_0._40_4_;
                      auVar36._12_4_ = tray.org.field_0._44_4_;
                      auVar55 = vmulps_avx512vl(auVar77,(undefined1  [16])
                                                        tray.dir.field_0.field_0.z.field_0);
                      auVar56 = vmulps_avx512vl(auVar75,(undefined1  [16])
                                                        tray.dir.field_0.field_0.z.field_0);
                      auVar103._0_4_ = tray.dir.field_0._32_4_ * fVar6;
                      auVar103._4_4_ = tray.dir.field_0._36_4_ * fVar6;
                      auVar103._8_4_ = tray.dir.field_0._40_4_ * fVar6;
                      auVar103._12_4_ = tray.dir.field_0._44_4_ * fVar6;
                      auVar55 = vfmadd231ps_avx512vl
                                          (auVar55,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar94);
                      auVar56 = vfmadd231ps_avx512vl
                                          (auVar56,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar92);
                      auVar62 = vfmadd231ps_avx512vl
                                          (auVar103,auVar91,
                                           (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                      auVar55 = vfmadd231ps_avx512vl
                                          (auVar55,(undefined1  [16])
                                                   tray.dir.field_0.field_0.x.field_0,auVar83);
                      auVar56 = vfmadd231ps_avx512vl
                                          (auVar56,(undefined1  [16])
                                                   tray.dir.field_0.field_0.x.field_0,auVar81);
                      auVar62 = vfmadd231ps_avx512vl
                                          (auVar62,auVar79,
                                           (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                      auVar64 = auVar104._0_16_;
                      auVar63 = vandps_avx512vl(auVar55,auVar64);
                      auVar68 = auVar105._0_16_;
                      uVar51 = vcmpps_avx512vl(auVar63,auVar68,1);
                      bVar49 = (bool)((byte)uVar51 & 1);
                      iVar52 = auVar105._0_4_;
                      auVar65._0_4_ = (uint)bVar49 * iVar52 | (uint)!bVar49 * auVar55._0_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 1) & 1);
                      iVar70 = auVar105._4_4_;
                      auVar65._4_4_ = (uint)bVar49 * iVar70 | (uint)!bVar49 * auVar55._4_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 2) & 1);
                      iVar71 = auVar105._8_4_;
                      iVar72 = auVar105._12_4_;
                      auVar65._8_4_ = (uint)bVar49 * iVar71 | (uint)!bVar49 * auVar55._8_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 3) & 1);
                      auVar65._12_4_ = (uint)bVar49 * iVar72 | (uint)!bVar49 * auVar55._12_4_;
                      auVar55 = vandps_avx512vl(auVar56,auVar64);
                      uVar51 = vcmpps_avx512vl(auVar55,auVar68,1);
                      bVar49 = (bool)((byte)uVar51 & 1);
                      auVar66._0_4_ = (uint)bVar49 * iVar52 | (uint)!bVar49 * auVar56._0_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 1) & 1);
                      auVar66._4_4_ = (uint)bVar49 * iVar70 | (uint)!bVar49 * auVar56._4_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 2) & 1);
                      auVar66._8_4_ = (uint)bVar49 * iVar71 | (uint)!bVar49 * auVar56._8_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 3) & 1);
                      auVar66._12_4_ = (uint)bVar49 * iVar72 | (uint)!bVar49 * auVar56._12_4_;
                      auVar55 = vandps_avx512vl(auVar62,auVar64);
                      uVar51 = vcmpps_avx512vl(auVar55,auVar68,1);
                      bVar49 = (bool)((byte)uVar51 & 1);
                      auVar67._0_4_ = (uint)bVar49 * iVar52 | (uint)!bVar49 * auVar62._0_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 1) & 1);
                      auVar67._4_4_ = (uint)bVar49 * iVar70 | (uint)!bVar49 * auVar62._4_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 2) & 1);
                      auVar67._8_4_ = (uint)bVar49 * iVar71 | (uint)!bVar49 * auVar62._8_4_;
                      bVar49 = (bool)((byte)(uVar51 >> 3) & 1);
                      auVar67._12_4_ = (uint)bVar49 * iVar72 | (uint)!bVar49 * auVar62._12_4_;
                      auVar55 = vrcp14ps_avx512vl(auVar65);
                      auVar56 = vfnmadd213ps_avx512vl(auVar65,auVar55,auVar69);
                      auVar56 = vfmadd132ps_avx512vl(auVar56,auVar55,auVar55);
                      auVar55 = vrcp14ps_avx512vl(auVar66);
                      auVar62 = vfnmadd213ps_avx512vl(auVar66,auVar55,auVar69);
                      auVar62 = vfmadd132ps_avx512vl(auVar62,auVar55,auVar55);
                      auVar55 = vrcp14ps_avx512vl(auVar67);
                      auVar63 = vfnmadd213ps_avx512vl(auVar67,auVar55,auVar69);
                      uVar47 = *(undefined4 *)(uVar41 + 0xb0 + uVar50 * 4);
                      auVar30._4_4_ = uVar47;
                      auVar30._0_4_ = uVar47;
                      auVar30._8_4_ = uVar47;
                      auVar30._12_4_ = uVar47;
                      auVar64 = vfmadd213ps_avx512vl(auVar77,auVar36,auVar30);
                      uVar47 = *(undefined4 *)(uVar41 + 0xc0 + uVar50 * 4);
                      auVar31._4_4_ = uVar47;
                      auVar31._0_4_ = uVar47;
                      auVar31._8_4_ = uVar47;
                      auVar31._12_4_ = uVar47;
                      auVar68 = vfmadd213ps_avx512vl(auVar75,auVar36,auVar31);
                      auVar63 = vfmadd132ps_avx512vl(auVar63,auVar55,auVar55);
                      uVar47 = *(undefined4 *)(uVar41 + 0xd0 + uVar50 * 4);
                      auVar32._4_4_ = uVar47;
                      auVar32._0_4_ = uVar47;
                      auVar32._8_4_ = uVar47;
                      auVar32._12_4_ = uVar47;
                      auVar55 = vfmadd213ps_avx512vl(auVar73,auVar36,auVar32);
                      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar35,auVar94);
                      auVar68 = vfmadd231ps_avx512vl(auVar68,auVar35,auVar92);
                      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar35,auVar91);
                      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar34,auVar83);
                      auVar68 = vfmadd231ps_avx512vl(auVar68,auVar34,auVar81);
                      auVar69 = vfmadd231ps_avx512vl(auVar55,auVar34,auVar79);
                      auVar55 = vsubps_avx(auVar54,auVar64);
                      auVar54 = vmulps_avx512vl(auVar56,auVar55);
                      auVar55 = vsubps_avx(auVar59,auVar68);
                      auVar59 = vmulps_avx512vl(auVar62,auVar55);
                      auVar55 = vsubps_avx(auVar53,auVar69);
                      auVar84._0_4_ = auVar63._0_4_ * auVar55._0_4_;
                      auVar84._4_4_ = auVar63._4_4_ * auVar55._4_4_;
                      auVar84._8_4_ = auVar63._8_4_ * auVar55._8_4_;
                      auVar84._12_4_ = auVar63._12_4_ * auVar55._12_4_;
                      auVar55 = vsubps_avx(auVar102,auVar64);
                      auVar53 = vmulps_avx512vl(auVar56,auVar55);
                      auVar55 = vsubps_avx(auVar61,auVar68);
                      auVar61 = vmulps_avx512vl(auVar62,auVar55);
                      auVar55 = vsubps_avx(auVar97,auVar69);
                      auVar74._0_4_ = auVar63._0_4_ * auVar55._0_4_;
                      auVar74._4_4_ = auVar63._4_4_ * auVar55._4_4_;
                      auVar74._8_4_ = auVar63._8_4_ * auVar55._8_4_;
                      auVar74._12_4_ = auVar63._12_4_ * auVar55._12_4_;
                      auVar55 = vpminsd_avx(auVar54,auVar53);
                      auVar56 = vpminsd_avx(auVar59,auVar61);
                      auVar55 = vpmaxsd_avx(auVar55,auVar56);
                      auVar56 = vpminsd_avx(auVar84,auVar74);
                      auVar56 = vpmaxsd_avx(auVar55,auVar56);
                      auVar55 = vpmaxsd_avx(auVar54,auVar53);
                      auVar54 = vpmaxsd_avx(auVar59,auVar61);
                      auVar54 = vpminsd_avx(auVar55,auVar54);
                      auVar55 = vpmaxsd_avx(auVar84,auVar74);
                      auVar55 = vpminsd_avx(auVar54,auVar55);
                      auVar54 = vpmaxsd_avx(auVar56,(undefined1  [16])tray.tnear.field_0);
                      auVar55 = vpminsd_avx(auVar55,(undefined1  [16])tray.tfar.field_0);
                      uVar14 = vcmpps_avx512vl(auVar54,auVar55,2);
                      bVar37 = (byte)uVar14;
                    }
                    bVar37 = bVar37 & (byte)uVar13;
                    if (bVar37 != 0) {
                      auVar56 = vblendmps_avx512vl(auVar109._0_16_,auVar56);
                      bVar49 = (bool)(bVar37 >> 1 & 1);
                      bVar4 = (bool)(bVar37 >> 2 & 1);
                      bVar5 = (bool)(bVar37 >> 3 & 1);
                      if (root.ptr != 8) {
                        pNVar45->ptr = root.ptr;
                        pNVar45 = pNVar45 + 1;
                        *paVar48 = auVar110._0_16_;
                        paVar48 = paVar48 + 1;
                      }
                      auVar110 = ZEXT1664(CONCAT412((uint)bVar5 * auVar56._12_4_ |
                                                    (uint)!bVar5 * auVar55._12_4_,
                                                    CONCAT48((uint)bVar4 * auVar56._8_4_ |
                                                             (uint)!bVar4 * auVar55._8_4_,
                                                             CONCAT44((uint)bVar49 * auVar56._4_4_ |
                                                                      (uint)!bVar49 * auVar55._4_4_,
                                                                      (uint)(bVar37 & 1) *
                                                                      auVar56._0_4_ |
                                                                      (uint)!(bool)(bVar37 & 1) *
                                                                      auVar55._0_4_))));
                      root.ptr = sVar2;
                    }
                  }
                } while ((sVar2 != 8) && (bVar49 = uVar50 < 3, uVar50 = uVar50 + 1, bVar49));
                iVar52 = 0;
                if (root.ptr == 8) {
LAB_00744e6d:
                  bVar49 = false;
                  iVar52 = 4;
                }
                else {
                  uVar13 = vcmpps_avx512vl((undefined1  [16])auVar110._0_16_,
                                           (undefined1  [16])tray.tfar.field_0,9);
                  bVar49 = true;
                  if ((uint)POPCOUNT((int)uVar13) <= uVar46) {
                    pNVar45->ptr = root.ptr;
                    pNVar45 = pNVar45 + 1;
                    *paVar48 = auVar110._0_16_;
                    paVar48 = paVar48 + 1;
                    goto LAB_00744e6d;
                  }
                }
              } while (bVar49);
            }
          }
        }
      } while (iVar52 != 3);
      bVar40 = (byte)uVar43 & bVar40;
      bVar49 = (bool)(bVar40 >> 1 & 1);
      bVar4 = (bool)(bVar40 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar40 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar40 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar49 * auVar108._4_4_ | (uint)!bVar49 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar4 * auVar108._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar40 >> 3) * auVar108._12_4_ | (uint)!(bool)(bVar40 >> 3) * *(int *)(ray + 0x8c)
      ;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }